

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O0

bool __thiscall
DIS::IncomingMessage::AddProcessor(IncomingMessage *this,uchar id,IPacketProcessor *pp)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_> local_40;
  iterator containerIter;
  value_type candidate;
  IPacketProcessor *pp_local;
  IncomingMessage *pIStack_18;
  uchar id_local;
  IncomingMessage *this_local;
  
  candidate.second = pp;
  pp_local._7_1_ = id;
  pIStack_18 = this;
  std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>::
  pair<unsigned_char_&,_DIS::IPacketProcessor_*&,_true>
            ((pair<const_unsigned_char,_DIS::IPacketProcessor_*> *)&containerIter,
             (uchar *)((long)&pp_local + 7),&candidate.second);
  std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>::
  _Rb_tree_iterator(&local_40);
  bVar1 = FindProccessorContainer(this,pp_local._7_1_,candidate.second,&local_40);
  if (!bVar1) {
    std::
    multimap<unsigned_char,DIS::IPacketProcessor*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
    ::insert<std::pair<unsigned_char_const,DIS::IPacketProcessor*>&>
              ((multimap<unsigned_char,DIS::IPacketProcessor*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
                *)&this->_processors,
               (pair<const_unsigned_char,_DIS::IPacketProcessor_*> *)&containerIter);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool IncomingMessage::AddProcessor(unsigned char id, IPacketProcessor* pp)
{
   PacketProcessorContainer::value_type candidate(id,pp);
   PacketProcessorContainer::iterator containerIter;

   // If this id doesn't already have this processor (it shouldn't)
   if (!FindProccessorContainer(id, pp, containerIter))
   {
       _processors.insert( candidate );
       return true;
   }

   return false;    
}